

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_type.c
# Opt level: O0

type_conflict
type_create(type_id id,char *name,type_impl impl,type_impl_interface_singleton singleton)

{
  int iVar1;
  type __ptr;
  size_t sVar2;
  char *pcVar3;
  type_interface ptVar4;
  code *in_RCX;
  type_impl in_RDX;
  char *in_RSI;
  type_id in_EDI;
  size_t name_size;
  type_conflict t;
  
  iVar1 = type_id_invalid(in_EDI);
  if (((iVar1 != 0) && (in_RSI != (char *)0x0)) && (__ptr = (type)malloc(0x20), __ptr != (type)0x0))
  {
    sVar2 = strlen(in_RSI);
    pcVar3 = (char *)malloc(sVar2 + 1);
    __ptr->name = pcVar3;
    if (__ptr->name == (char *)0x0) {
      free(__ptr);
      return (type_conflict)0x0;
    }
    memcpy(__ptr->name,in_RSI,sVar2 + 1);
    __ptr->id = in_EDI;
    __ptr->impl = in_RDX;
    if (in_RCX == (code *)0x0) {
      __ptr->interface = (type_interface)0x0;
    }
    else {
      ptVar4 = (type_interface)(*in_RCX)();
      __ptr->interface = ptVar4;
    }
    if (__ptr->interface == (type_interface)0x0) {
      return __ptr;
    }
    if (__ptr->interface->create == (type_impl_interface_create)0x0) {
      return __ptr;
    }
    iVar1 = (*__ptr->interface->create)(__ptr,in_RDX);
    if (iVar1 == 0) {
      return __ptr;
    }
    free(__ptr);
  }
  return (type_conflict)0x0;
}

Assistant:

type type_create(type_id id, const char *name, type_impl impl, type_impl_interface_singleton singleton)
{
	if (type_id_invalid(id) != 0 && name != NULL)
	{
		type t = malloc(sizeof(struct type_type));

		if (t)
		{
			size_t name_size = strlen(name) + 1;

			t->name = malloc(sizeof(char) * name_size);

			if (t->name == NULL)
			{
				/* error */

				free(t);

				return NULL;
			}

			memcpy(t->name, name, name_size);

			t->id = id;

			t->impl = impl;

			if (singleton != NULL)
			{
				t->interface = singleton();
			}
			else
			{
				t->interface = NULL;
			}

			if (t->interface != NULL && t->interface->create != NULL)
			{
				if (t->interface->create(t, impl) == 0)
				{
					return t;
				}
			}
			else
			{
				return t;
			}

			free(t);
		}
	}

	return NULL;
}